

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int getnum_aux(lua_State *L,lua_State *L1,char **pc)

{
  char *pcVar1;
  lua_Integer lVar2;
  int local_30;
  int local_2c;
  int sig;
  int res;
  char **pc_local;
  lua_State *L1_local;
  lua_State *L_local;
  
  local_2c = 0;
  local_30 = 1;
  skip(pc);
  if (**pc == '.') {
    lVar2 = lua_tointegerx(L1,-1,(int *)0x0);
    L_local._4_4_ = (int)lVar2;
    lua_settop(L1,-2);
    *pc = *pc + 1;
  }
  else if (**pc == '*') {
    L_local._4_4_ = lua_gettop(L1);
    *pc = *pc + 1;
  }
  else {
    if (**pc == '-') {
      local_30 = -1;
      *pc = *pc + 1;
    }
    if ((""[(int)((byte)**pc + 1)] & 2) == 0) {
      luaL_error(L,"number expected (%s)",*pc);
    }
    while ((""[(int)((byte)**pc + 1)] & 2) != 0) {
      pcVar1 = *pc;
      *pc = pcVar1 + 1;
      local_2c = local_2c * 10 + (int)*pcVar1 + -0x30;
    }
    L_local._4_4_ = local_30 * local_2c;
  }
  return L_local._4_4_;
}

Assistant:

static int getnum_aux (lua_State *L, lua_State *L1, const char **pc) {
  int res = 0;
  int sig = 1;
  skip(pc);
  if (**pc == '.') {
    res = cast_int(lua_tointeger(L1, -1));
    lua_pop(L1, 1);
    (*pc)++;
    return res;
  }
  else if (**pc == '*') {
    res = lua_gettop(L1);
    (*pc)++;
    return res;
  }
  else if (**pc == '-') {
    sig = -1;
    (*pc)++;
  }
  if (!lisdigit(cast_uchar(**pc)))
    luaL_error(L, "number expected (%s)", *pc);
  while (lisdigit(cast_uchar(**pc))) res = res*10 + (*(*pc)++) - '0';
  return sig*res;
}